

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O1

void __thiscall VW::vw_exception::vw_exception(vw_exception *this,vw_exception *ex)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__vw_exception_002cefb8;
  this->file = ex->file;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (ex->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + (ex->message)._M_string_length);
  this->lineNumber = ex->lineNumber;
  return;
}

Assistant:

vw_exception::vw_exception(const vw_exception& ex) : file(ex.file), message(ex.message), lineNumber(ex.lineNumber) {}